

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signature.cpp
# Opt level: O1

void __thiscall Kernel::Signature::~Signature(Signature *this)

{
  Unit **ppUVar1;
  Symbol **ppSVar2;
  TermList *pTVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  
  uVar6 = (ulong)((long)(this->_funs)._cursor - (long)(this->_funs)._stack) >> 3 & 0xffffffff;
  while( true ) {
    uVar6 = uVar6 - 1;
    if ((int)(uint)uVar6 < 0) break;
    Symbol::destroyFnSymbol((this->_funs)._stack[(uint)uVar6 & 0x7fffffff]);
  }
  uVar5 = (int)((ulong)((long)(this->_preds)._cursor - (long)(this->_preds)._stack) >> 3) - 1;
  if (-1 < (int)uVar5) {
    lVar8 = (ulong)uVar5 + 1;
    do {
      Symbol::destroyPredSymbol((this->_preds)._stack[lVar8 + -1]);
      lVar7 = lVar8 + -1;
      bVar4 = 0 < lVar8;
      lVar8 = lVar7;
    } while (lVar7 != 0 && bVar4);
  }
  uVar5 = (int)((ulong)((long)(this->_typeCons)._cursor - (long)(this->_typeCons)._stack) >> 3) - 1;
  if (-1 < (int)uVar5) {
    lVar8 = (ulong)uVar5 + 1;
    do {
      Symbol::destroyTypeConSymbol((this->_typeCons)._stack[lVar8 + -1]);
      lVar7 = lVar8 + -1;
      bVar4 = 0 < lVar8;
      lVar8 = lVar7;
    } while (lVar7 != 0 && bVar4);
  }
  ::Lib::DHMap<unsigned_int,_Shell::TermAlgebra_*,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            (&this->_termAlgebras);
  ::Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            (&this->_boolDefPreds);
  ::Lib::DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            (&(this->_fnDefPreds)._map);
  ::Lib::
  DHMap<std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::~DHMap(&this->_iSymbols);
  ::Lib::Stack<Lib::SmartPtr<Lib::Stack<unsigned_int>_>_>::~Stack(&this->_distinctGroupMembers);
  ppUVar1 = (this->_distinctGroupPremises)._stack;
  if (ppUVar1 != (Unit **)0x0) {
    uVar6 = (this->_distinctGroupPremises)._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar6 == 0) {
      *ppUVar1 = (Unit *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = ppUVar1;
    }
    else if (uVar6 < 0x11) {
      *ppUVar1 = (Unit *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = ppUVar1;
    }
    else if (uVar6 < 0x19) {
      *ppUVar1 = (Unit *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = ppUVar1;
    }
    else if (uVar6 < 0x21) {
      *ppUVar1 = (Unit *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = ppUVar1;
    }
    else if (uVar6 < 0x31) {
      *ppUVar1 = (Unit *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = ppUVar1;
    }
    else if (uVar6 < 0x41) {
      *ppUVar1 = (Unit *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = ppUVar1;
    }
    else {
      operator_delete(ppUVar1,0x10);
    }
  }
  ::Lib::
  Map<Lib::Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>,_unsigned_int,_Lib::DefaultHash>
  ::clear(&this->_varNames);
  ::Lib::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_Lib::DefaultHash>
  ::clear(&this->_arityCheck);
  ::Lib::
  Map<Lib::Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>,_unsigned_int,_Lib::DefaultHash>
  ::clear(&this->_typeConNames);
  ::Lib::
  Map<Lib::Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>,_unsigned_int,_Lib::DefaultHash>
  ::clear(&this->_predNames);
  ::Lib::
  Map<Lib::Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>,_unsigned_int,_Lib::DefaultHash>
  ::clear(&this->_funNames);
  ::Lib::DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            (&(this->_choiceSymbols)._map);
  ppSVar2 = (this->_typeCons)._stack;
  if (ppSVar2 != (Symbol **)0x0) {
    uVar6 = (this->_typeCons)._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar6 == 0) {
      *ppSVar2 = (Symbol *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = ppSVar2;
    }
    else if (uVar6 < 0x11) {
      *ppSVar2 = (Symbol *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = ppSVar2;
    }
    else if (uVar6 < 0x19) {
      *ppSVar2 = (Symbol *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = ppSVar2;
    }
    else if (uVar6 < 0x21) {
      *ppSVar2 = (Symbol *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = ppSVar2;
    }
    else if (uVar6 < 0x31) {
      *ppSVar2 = (Symbol *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = ppSVar2;
    }
    else if (uVar6 < 0x41) {
      *ppSVar2 = (Symbol *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = ppSVar2;
    }
    else {
      operator_delete(ppSVar2,0x10);
    }
  }
  ppSVar2 = (this->_preds)._stack;
  if (ppSVar2 != (Symbol **)0x0) {
    uVar6 = (this->_preds)._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar6 == 0) {
      *ppSVar2 = (Symbol *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = ppSVar2;
    }
    else if (uVar6 < 0x11) {
      *ppSVar2 = (Symbol *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = ppSVar2;
    }
    else if (uVar6 < 0x19) {
      *ppSVar2 = (Symbol *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = ppSVar2;
    }
    else if (uVar6 < 0x21) {
      *ppSVar2 = (Symbol *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = ppSVar2;
    }
    else if (uVar6 < 0x31) {
      *ppSVar2 = (Symbol *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = ppSVar2;
    }
    else if (uVar6 < 0x41) {
      *ppSVar2 = (Symbol *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = ppSVar2;
    }
    else {
      operator_delete(ppSVar2,0x10);
    }
  }
  ppSVar2 = (this->_funs)._stack;
  if (ppSVar2 != (Symbol **)0x0) {
    uVar6 = (this->_funs)._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar6 == 0) {
      *ppSVar2 = (Symbol *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = ppSVar2;
    }
    else if (uVar6 < 0x11) {
      *ppSVar2 = (Symbol *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = ppSVar2;
    }
    else if (uVar6 < 0x19) {
      *ppSVar2 = (Symbol *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = ppSVar2;
    }
    else if (uVar6 < 0x21) {
      *ppSVar2 = (Symbol *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = ppSVar2;
    }
    else if (uVar6 < 0x31) {
      *ppSVar2 = (Symbol *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = ppSVar2;
    }
    else if (uVar6 < 0x41) {
      *ppSVar2 = (Symbol *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = ppSVar2;
    }
    else {
      operator_delete(ppSVar2,0x10);
    }
  }
  ::Lib::DHMap<Kernel::Term_*,_int,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            (&this->_formulaCounts);
  pTVar3 = (this->_dividesNvalues)._stack;
  if (pTVar3 != (TermList *)0x0) {
    uVar6 = (this->_dividesNvalues)._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar6 == 0) {
      pTVar3->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pTVar3;
    }
    else if (uVar6 < 0x11) {
      pTVar3->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pTVar3;
    }
    else if (uVar6 < 0x19) {
      pTVar3->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pTVar3;
    }
    else if (uVar6 < 0x21) {
      pTVar3->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pTVar3;
    }
    else if (uVar6 < 0x31) {
      pTVar3->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pTVar3;
    }
    else {
      if (0x40 < uVar6) {
        operator_delete(pTVar3,0x10);
        return;
      }
      pTVar3->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pTVar3;
    }
  }
  return;
}

Assistant:

Signature::~Signature ()
{
  for (int i = _funs.length()-1;i >= 0;i--) {
    _funs[i]->destroyFnSymbol();
  }
  for (int i = _preds.length()-1;i >= 0;i--) {
    _preds[i]->destroyPredSymbol();
  }
  for (int i = _typeCons.length()-1;i >= 0;i--) {
    _typeCons[i]->destroyTypeConSymbol();
  }
}